

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O0

int yaml_emitter_analyze_tag(yaml_emitter_t *emitter,yaml_char_t *tag)

{
  int iVar1;
  size_t sVar2;
  yaml_char_t *pyVar3;
  size_t sVar4;
  size_t prefix_length;
  yaml_tag_directive_t *tag_directive;
  yaml_string_t string;
  size_t tag_length;
  yaml_char_t *tag_local;
  yaml_emitter_t *emitter_local;
  
  sVar2 = strlen((char *)tag);
  pyVar3 = tag + sVar2;
  if (tag == pyVar3) {
    emitter_local._4_4_ = yaml_emitter_set_emitter_error(emitter,"tag value must not be empty");
  }
  else {
    for (prefix_length = (size_t)(emitter->tag_directives).start;
        (yaml_tag_directive_t *)prefix_length != (emitter->tag_directives).top;
        prefix_length = prefix_length + 0x10) {
      sVar2 = strlen(*(char **)(prefix_length + 8));
      if ((sVar2 < (ulong)((long)pyVar3 - (long)tag)) &&
         (iVar1 = strncmp(*(char **)(prefix_length + 8),(char *)tag,sVar2), iVar1 == 0)) {
        (emitter->tag_data).handle = *(yaml_char_t **)prefix_length;
        sVar4 = strlen(*(char **)prefix_length);
        (emitter->tag_data).handle_length = sVar4;
        (emitter->tag_data).suffix = tag + sVar2;
        (emitter->tag_data).suffix_length = (size_t)(pyVar3 + (-sVar2 - (long)tag));
        return 1;
      }
    }
    (emitter->tag_data).suffix = tag;
    (emitter->tag_data).suffix_length = (long)pyVar3 - (long)tag;
    emitter_local._4_4_ = 1;
  }
  return emitter_local._4_4_;
}

Assistant:

static int
yaml_emitter_analyze_tag(yaml_emitter_t *emitter,
        yaml_char_t *tag)
{
    size_t tag_length;
    yaml_string_t string;
    yaml_tag_directive_t *tag_directive;

    tag_length = strlen((char *)tag);
    STRING_ASSIGN(string, tag, tag_length);

    if (string.start == string.end) {
        return yaml_emitter_set_emitter_error(emitter,
                "tag value must not be empty");
    }

    for (tag_directive = emitter->tag_directives.start;
            tag_directive != emitter->tag_directives.top; tag_directive ++) {
        size_t prefix_length = strlen((char *)tag_directive->prefix);
        if (prefix_length < (size_t)(string.end - string.start)
                && strncmp((char *)tag_directive->prefix, (char *)string.start,
                    prefix_length) == 0)
        {
            emitter->tag_data.handle = tag_directive->handle;
            emitter->tag_data.handle_length =
                strlen((char *)tag_directive->handle);
            emitter->tag_data.suffix = string.start + prefix_length;
            emitter->tag_data.suffix_length =
                (string.end - string.start) - prefix_length;
            return 1;
        }
    }

    emitter->tag_data.suffix = string.start;
    emitter->tag_data.suffix_length = string.end - string.start;

    return 1;
}